

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O1

int __thiscall
helics::zeromq::ZmqComms::initializeBrokerConnections(ZmqComms *this,socket_t *controlSocket)

{
  uint uVar1;
  bool bVar2;
  string *networkInterface;
  socket_base sVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  size_t size;
  int *piVar11;
  string *address;
  error_t *peVar12;
  socklen_t sVar13;
  undefined8 uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  undefined8 uVar19;
  context_t *context_;
  void *in_R8;
  socklen_t in_R9D;
  uint __len;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> brkprt;
  socket_t brokerReq;
  string str;
  ActionMessage M_4;
  ActionMessage M_1;
  shared_ptr<ZmqContextManager> ctx;
  message_t msg;
  pollitem_t poller;
  ActionMessage getPorts;
  int local_408;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_3d8;
  string *local_3b0;
  socket_t local_3a8;
  undefined4 local_394;
  string local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340 [10];
  undefined1 local_298 [184];
  ulong local_1e0;
  ulong local_1d8;
  string *local_190;
  ZmqContextManager local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  undefined2 local_ec;
  undefined1 local_e8 [184];
  size_type sVar20;
  
  if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
    if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
      iVar6 = getDefaultPort(1);
      LOCK();
      (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = iVar6;
      UNLOCK();
      ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_protocol);
      local_e8._4_4_ = 0x5ab;
      local_e8._20_4_ = (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i
      ;
      ActionMessage::to_string_abi_cxx11_((string *)local_298,(ActionMessage *)local_e8);
      iVar6 = zmq_send((controlSocket->super_socket_base)._handle,local_298._0_8_,local_298._8_8_,0)
      ;
      if ((iVar6 < 0) && (iVar6 = zmq_errno(), iVar6 != 0xb)) {
        peVar12 = (error_t *)__cxa_allocate_exception(0x10);
        zmq::error_t::error_t(peVar12);
        __cxa_throw(peVar12,&zmq::error_t::typeinfo,std::exception::~exception);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
      }
      ActionMessage::~ActionMessage((ActionMessage *)local_e8);
    }
  }
  else {
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_e8 + 0x10);
    local_e8._8_8_ = 0;
    local_e8._16_4_ = local_e8._16_4_ & 0xffffff00;
    local_e8._0_8_ = paVar17;
    ZmqContextManager::getContextPointer(&local_168,(string *)local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ != paVar17) {
      operator_delete((void *)local_e8._0_8_,CONCAT44(local_e8._20_4_,local_e8._16_4_) + 1);
    }
    if ((this->super_NetworkCommsInterface).brokerPort < 0) {
      iVar6 = getDefaultPort(1);
      (this->super_NetworkCommsInterface).brokerPort = iVar6;
    }
    zmq::socket_t::socket_t(&local_3a8,*(context_t **)(local_168.name._M_dataplus._M_p + 0x20),3);
    local_e8._0_4_ = 0x32;
    sVar13 = 4;
    zmq::detail::socket_base::setsockopt
              (&local_3a8.super_socket_base,0x11,(int)local_e8,4,in_R8,in_R9D);
    local_3b0 = &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress;
    gmlc::networking::makePortAddress
              ((string *)local_e8,local_3b0,(this->super_NetworkCommsInterface).brokerPort + 1);
    uVar19 = local_e8._0_8_;
    uVar7 = zmq::detail::socket_base::connect
                      (&local_3a8.super_socket_base,(int)local_e8._0_8_,__addr,sVar13);
    uVar16 = (ulong)uVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ != paVar17) {
      uVar19 = CONCAT44(local_e8._20_4_,local_e8._16_4_) + 1;
      operator_delete((void *)local_e8._0_8_,uVar19);
      uVar16 = extraout_RAX;
    }
    local_394 = (undefined4)CONCAT71((int7)(uVar16 >> 8),1);
    LOCK();
    (this->super_NetworkCommsInterface).hasBroker._M_base._M_i = true;
    UNLOCK();
    zmq_msg_init(local_138);
    iVar6 = (int)uVar19;
    if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
      local_190 = &(this->super_NetworkCommsInterface).super_CommsInterface.name;
      local_1d8 = 0;
      local_1e0 = 0;
      do {
        iVar6 = (int)uVar19;
        iVar9 = (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
        local_394 = CONCAT31((int3)((uint)iVar9 >> 8),-1 < iVar9);
        if (-1 < iVar9) break;
        if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i
            & 1U) != 0) {
          ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_protocol);
          local_e8._4_4_ = 0x9db;
          ActionMessage::to_string_abi_cxx11_((string *)local_298,(ActionMessage *)local_e8);
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298._0_8_;
          iVar9 = zmq_send((controlSocket->super_socket_base)._handle,local_298._0_8_,
                           local_298._8_8_,0);
          iVar6 = (int)paVar17;
          if ((iVar9 < 0) && (iVar9 = zmq_errno(), iVar9 != 0xb)) {
            peVar12 = (error_t *)__cxa_allocate_exception(0x10);
            zmq::error_t::error_t(peVar12);
            __cxa_throw(peVar12,&zmq::error_t::typeinfo,std::exception::~exception);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_298 + 0x10)) {
            uVar16 = local_298._16_8_ + 1;
            operator_delete((void *)local_298._0_8_,uVar16);
            iVar6 = (int)uVar16;
          }
          ActionMessage::~ActionMessage((ActionMessage *)local_e8);
          local_408 = -3;
          break;
        }
        NetworkCommsInterface::generatePortRequest
                  ((ActionMessage *)local_e8,&this->super_NetworkCommsInterface,
                   (this->super_NetworkCommsInterface).super_CommsInterface.serverMode + 1);
        if ((this->super_NetworkCommsInterface).super_CommsInterface.useJsonSerialization == true) {
          local_e8[0x1a] = local_e8[0x1a] | 0x40;
          ActionMessage::to_json_string_abi_cxx11_(&local_370,(ActionMessage *)local_e8);
        }
        else {
          ActionMessage::to_string_abi_cxx11_(&local_370,(ActionMessage *)local_e8);
        }
        uVar14 = 0;
        uVar19 = local_370._M_dataplus._M_p;
        iVar6 = zmq_send(local_3a8.super_socket_base._handle,local_370._M_dataplus._M_p,
                         local_370._M_string_length,0);
        if ((iVar6 < 0) && (iVar6 = zmq_errno(), iVar6 != 0xb)) {
          peVar12 = (error_t *)__cxa_allocate_exception(0x10);
          zmq::error_t::error_t(peVar12);
          __cxa_throw(peVar12,&zmq::error_t::typeinfo,std::exception::~exception);
        }
        local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_3a8.super_socket_base._handle;
        local_ec = 1;
        uVar7 = -(int)local_1d8;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71((int7)((ulong)uVar14 >> 8),1);
        do {
          paVar15 = paVar17;
          if (((ulong)paVar15 & 1) == 0) {
            local_1d8 = (ulong)-uVar7;
            paVar17 = paVar15;
            goto LAB_00278224;
          }
          uVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x1;
          iVar6 = zmq_poll(&local_f8,1,
                           (this->super_NetworkCommsInterface).super_CommsInterface.
                           connectionTimeout.__r);
          iVar9 = (int)uVar19;
          if (iVar6 < 0) {
            peVar12 = (error_t *)__cxa_allocate_exception(0x10);
            zmq::error_t::error_t(peVar12);
            __cxa_throw(peVar12,&zmq::error_t::typeinfo,std::exception::~exception);
          }
          uVar7 = uVar7 - 1;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        } while (iVar6 != 0);
        local_1d8 = (ulong)-uVar7;
        if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i
            & 1U) == 0) {
          if (uVar7 == 0xffffffff) {
            message._M_str = "zmq broker connection timed out, trying again (2)";
            message._M_len = 0x31;
            CommsInterface::logWarning((CommsInterface *)this,message);
            local_350._M_allocated_capacity = (size_type)local_340;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_350,"sending message to ","");
            gmlc::networking::makePortAddress
                      (&local_3d8.first,local_3b0,(this->super_NetworkCommsInterface).brokerPort + 1
                      );
            uVar19 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_350._M_allocated_capacity != local_340) {
              uVar19 = local_340[0]._M_allocated_capacity;
            }
            in_R8 = (void *)local_350._8_8_;
            if ((ulong)uVar19 < local_3d8.first._M_string_length + local_350._8_8_) {
              uVar19 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8.first._M_dataplus._M_p != &local_3d8.first.field_2) {
                uVar19 = local_3d8.first.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar19 < local_3d8.first._M_string_length + local_350._8_8_)
              goto LAB_00277ebf;
              pbVar10 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_3d8,0,0,(char *)local_350._M_allocated_capacity,
                                   local_350._8_8_);
            }
            else {
LAB_00277ebf:
              pbVar10 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_350,local_3d8.first._M_dataplus._M_p,
                                   local_3d8.first._M_string_length);
            }
            local_298._0_8_ = local_298 + 0x10;
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar10->_M_dataplus)._M_p;
            paVar17 = &pbVar10->field_2;
            if (paVar18 == paVar17) {
              local_298._16_8_ = paVar17->_M_allocated_capacity;
              local_298._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_298._16_8_ = paVar17->_M_allocated_capacity;
              local_298._0_8_ = paVar18;
            }
            sVar20 = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar10->_M_string_length = 0;
            paVar17->_M_local_buf[0] = '\0';
            message_00._M_str = (char *)local_298._0_8_;
            message_00._M_len = sVar20;
            local_298._8_8_ = sVar20;
            CommsInterface::logWarning((CommsInterface *)this,message_00);
            iVar9 = (int)sVar20;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_298 + 0x10)) {
              uVar16 = local_298._16_8_ + 1;
              operator_delete((void *)local_298._0_8_,uVar16);
              iVar9 = (int)uVar16;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8.first._M_dataplus._M_p != &local_3d8.first.field_2) {
              uVar16 = local_3d8.first.field_2._M_allocated_capacity + 1;
              operator_delete(local_3d8.first._M_dataplus._M_p,uVar16);
              iVar9 = (int)uVar16;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_350._M_allocated_capacity != local_340) {
              uVar16 = local_340[0]._M_allocated_capacity + 1;
              operator_delete((void *)local_350._M_allocated_capacity,uVar16);
              iVar9 = (int)uVar16;
            }
LAB_00277fb6:
            zmq::socket_t::close(&local_3a8,iVar9);
            context_ = *(context_t **)(local_168.name._M_dataplus._M_p + 0x20);
            zmq::socket_t::socket_t((socket_t *)local_298,context_,3);
            sVar3._handle = local_3a8.super_socket_base._handle;
            local_3a8.super_socket_base._handle = (void *)local_298._0_8_;
            local_298._0_8_ = sVar3._handle;
            zmq::socket_t::close((socket_t *)local_298,(int)context_);
            local_298._0_4_ = 0x32;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x4;
            zmq::detail::socket_base::setsockopt
                      (&local_3a8.super_socket_base,0x11,(int)(string *)local_298,4,in_R8,in_R9D);
            gmlc::networking::makePortAddress
                      ((string *)local_298,local_3b0,
                       (this->super_NetworkCommsInterface).brokerPort + 1);
            uVar19 = local_298._0_8_;
            zmq::detail::socket_base::connect
                      (&local_3a8.super_socket_base,(int)local_298._0_8_,__addr_00,
                       (socklen_t)paVar17);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_298 + 0x10)) {
              uVar19 = local_298._16_8_ + 1;
              operator_delete((void *)local_298._0_8_,uVar19);
            }
            local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_3a8.super_socket_base._handle;
          }
          else {
            uVar1 = (this->super_NetworkCommsInterface).maxRetries;
            if ((int)~uVar7 < (int)uVar1) goto LAB_00277fb6;
            uVar7 = -uVar1;
            if (0 < (int)uVar1) {
              uVar7 = uVar1;
            }
            __len = 1;
            if (9 < uVar7) {
              uVar16 = (ulong)uVar7;
              uVar5 = 4;
              do {
                __len = uVar5;
                uVar8 = (uint)uVar16;
                if (uVar8 < 100) {
                  __len = __len - 2;
                  goto LAB_0027808e;
                }
                if (uVar8 < 1000) {
                  __len = __len - 1;
                  goto LAB_0027808e;
                }
                if (uVar8 < 10000) goto LAB_0027808e;
                uVar16 = uVar16 / 10000;
                uVar5 = __len + 4;
              } while (99999 < uVar8);
              __len = __len + 1;
            }
LAB_0027808e:
            local_3d8.first._M_dataplus._M_p = (pointer)&local_3d8.first.field_2;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_3d8,(ulong)(-((int)uVar1 >> 0x1f) + __len),'-');
            CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_3d8.first._M_dataplus._M_p + (uint)-((int)uVar1 >> 0x1f),__len,uVar7);
            in_R8 = (void *)0x2d;
            pbVar10 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_3d8,0,0,"zmq broker connection timed out after trying ",
                                 0x2d);
            local_350._M_allocated_capacity = (size_type)local_340;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar10->_M_dataplus)._M_p;
            paVar18 = &pbVar10->field_2;
            if (paVar17 == paVar18) {
              local_340[0]._0_8_ = paVar18->_M_allocated_capacity;
              local_340[0]._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_340[0]._0_8_ = paVar18->_M_allocated_capacity;
              local_350._M_allocated_capacity = (size_type)paVar17;
            }
            local_350._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar18;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            pbVar10 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_350," times (2)");
            local_298._0_8_ = local_298 + 0x10;
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar10->_M_dataplus)._M_p;
            paVar17 = &pbVar10->field_2;
            if (paVar18 == paVar17) {
              local_298._16_8_ = paVar17->_M_allocated_capacity;
              local_298._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_298._16_8_ = paVar17->_M_allocated_capacity;
              local_298._0_8_ = paVar18;
            }
            local_298._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            message_01._M_str = (char *)local_298._0_8_;
            message_01._M_len = local_298._8_8_;
            CommsInterface::logError((CommsInterface *)this,message_01);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_298 + 0x10)) {
              operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_350._M_allocated_capacity != local_340) {
              operator_delete((void *)local_350._M_allocated_capacity,
                              local_340[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8.first._M_dataplus._M_p != &local_3d8.first.field_2) {
              operator_delete(local_3d8.first._M_dataplus._M_p,
                              local_3d8.first.field_2._M_allocated_capacity + 1);
            }
            uVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x4;
            CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
          }
LAB_00278224:
          if ((this->super_NetworkCommsInterface).super_CommsInterface.txStatus._M_i == ERRORED) {
            ActionMessage::ActionMessage((ActionMessage *)local_298,cmd_protocol);
            local_298._4_4_ = 0xa3f;
            ActionMessage::to_string_abi_cxx11_((string *)&local_350,(ActionMessage *)local_298);
            uVar19 = local_350._M_allocated_capacity;
            iVar6 = zmq_send((controlSocket->super_socket_base)._handle,
                             local_350._M_allocated_capacity,local_350._8_8_,0);
            if ((iVar6 < 0) && (iVar6 = zmq_errno(), iVar6 != 0xb)) {
              peVar12 = (error_t *)__cxa_allocate_exception(0x10);
              zmq::error_t::error_t(peVar12);
              __cxa_throw(peVar12,&zmq::error_t::typeinfo,std::exception::~exception);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_350._M_allocated_capacity != local_340) {
              uVar19 = local_340[0]._M_allocated_capacity + 1;
              operator_delete((void *)local_350._M_allocated_capacity,uVar19);
            }
            ActionMessage::~ActionMessage((ActionMessage *)local_298);
            local_408 = -1;
            goto LAB_002782d6;
          }
          if (((ulong)paVar15 & 1) == 0) {
            zmq::detail::socket_base::recv
                      (&local_3a8.super_socket_base,(int)local_138,(void *)0x0,(size_t)paVar17,
                       (int)in_R8);
            uVar19 = zmq_msg_data(local_138);
            size = zmq_msg_size(local_138);
            ActionMessage::ActionMessage((ActionMessage *)local_298,(void *)uVar19,size);
            bVar2 = true;
            if (((local_298._0_4_ == cmd_protocol_priority) || (local_298._0_4_ == cmd_protocol_big)
                ) || (local_298._0_4_ == cmd_protocol)) {
              iVar6 = (int)in_R8;
              if ((int)local_298._4_4_ < 0x9db) {
                if (local_298._4_4_ == 0x14d) {
                  message_02._M_str = "got new broker information";
                  message_02._M_len = 0x1a;
                  CommsInterface::logMessage((CommsInterface *)this,message_02);
                  sVar13 = (socklen_t)paVar17;
                  gmlc::networking::makePortAddress
                            ((string *)&local_350,local_3b0,
                             (this->super_NetworkCommsInterface).brokerPort + 1);
                  zmq::detail::socket_base::disconnect
                            (&local_3a8.super_socket_base,(char *)local_350._M_allocated_capacity);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_350._M_allocated_capacity != local_340) {
                    operator_delete((void *)local_350._M_allocated_capacity,
                                    local_340[0]._M_allocated_capacity + 1);
                  }
                  address = ActionMessage::getString_abi_cxx11_((ActionMessage *)local_298,0);
                  gmlc::networking::extractInterfaceAndPort(&local_3d8,(string *)address);
                  (this->super_NetworkCommsInterface).brokerPort = local_3d8.second;
                  iVar6 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&local_3d8,"?");
                  networkInterface = local_3b0;
                  if (iVar6 != 0) {
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_3b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_3d8);
                  }
                  gmlc::networking::makePortAddress
                            ((string *)&local_350,networkInterface,
                             (this->super_NetworkCommsInterface).brokerPort + 1);
                  uVar19 = local_350._M_allocated_capacity;
                  zmq::detail::socket_base::connect
                            (&local_3a8.super_socket_base,(int)local_350._M_allocated_capacity,
                             __addr_01,sVar13);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_350._M_allocated_capacity != local_340) {
                    uVar19 = local_340[0]._M_allocated_capacity + 1;
                    operator_delete((void *)local_350._M_allocated_capacity,uVar19);
                  }
                  bVar2 = true;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d8.first._M_dataplus._M_p != &local_3d8.first.field_2) {
                    uVar19 = local_3d8.first.field_2._M_allocated_capacity + 1;
                    operator_delete(local_3d8.first._M_dataplus._M_p,uVar19);
                  }
                }
                else if (local_298._4_4_ == 0x5ab) {
                  bVar2 = false;
                  uVar19 = local_138;
                  zmq::detail::socket_base::send
                            (&controlSocket->super_socket_base,(int)uVar19,(void *)0x0,
                             (size_t)paVar17,iVar6);
                  local_408 = 0;
                }
              }
              else {
                if (local_298._4_4_ == 0x9db) {
                  zmq::detail::socket_base::send
                            (&controlSocket->super_socket_base,(int)local_138,(void *)0x0,
                             (size_t)paVar17,iVar6);
                  uVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x2;
                  CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
                  local_408 = -3;
                }
                else {
                  if (local_298._4_4_ != 0xa3f) {
                    if (local_298._4_4_ == 0xed3) {
                      local_350._M_allocated_capacity = 2;
                      local_350._8_8_ = (void *)0x0;
                      do {
                        uVar19 = &local_350;
                        iVar6 = nanosleep((timespec *)uVar19,(timespec *)uVar19);
                        if (iVar6 != -1) break;
                        piVar11 = __errno_location();
                      } while (*piVar11 == 4);
                    }
                    goto LAB_0027856c;
                  }
                  zmq::detail::socket_base::send
                            (&controlSocket->super_socket_base,(int)local_138,(void *)0x0,
                             (size_t)paVar17,iVar6);
                  uVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x4;
                  CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
                  local_408 = -4;
                }
                bVar2 = false;
              }
            }
LAB_0027856c:
            ActionMessage::~ActionMessage((ActionMessage *)local_298);
            if (!bVar2) goto LAB_002782d6;
          }
          iVar6 = (int)local_1e0;
          bVar2 = iVar6 < (this->super_NetworkCommsInterface).maxRetries;
          if (!bVar2) {
            uVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x4;
            CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
            local_408 = -1;
          }
          local_1e0 = (ulong)(iVar6 + 1);
        }
        else {
          ActionMessage::ActionMessage((ActionMessage *)local_298,cmd_protocol);
          local_298._4_4_ = 0x9db;
          ActionMessage::to_string_abi_cxx11_((string *)&local_350,(ActionMessage *)local_298);
          uVar19 = local_350._M_allocated_capacity;
          iVar6 = zmq_send((controlSocket->super_socket_base)._handle,
                           local_350._M_allocated_capacity,local_350._8_8_,0);
          if ((iVar6 < 0) && (iVar6 = zmq_errno(), iVar6 != 0xb)) {
            peVar12 = (error_t *)__cxa_allocate_exception(0x10);
            zmq::error_t::error_t(peVar12);
            __cxa_throw(peVar12,&zmq::error_t::typeinfo,std::exception::~exception);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._M_allocated_capacity != local_340) {
            uVar19 = local_340[0]._M_allocated_capacity + 1;
            operator_delete((void *)local_350._M_allocated_capacity,uVar19);
          }
          ActionMessage::~ActionMessage((ActionMessage *)local_298);
          local_408 = -3;
LAB_002782d6:
          bVar2 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          uVar19 = local_370.field_2._M_allocated_capacity + 1;
          operator_delete(local_370._M_dataplus._M_p,uVar19);
        }
        ActionMessage::~ActionMessage((ActionMessage *)local_e8);
        iVar6 = (int)uVar19;
      } while (bVar2);
    }
    zmq_msg_close(local_138);
    uVar4 = local_394;
    zmq::socket_t::close(&local_3a8,iVar6);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.name._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.name._M_string_length);
    }
    if ((char)uVar4 == '\0') {
      return local_408;
    }
  }
  return 0;
}

Assistant:

int ZmqComms::initializeBrokerConnections(zmq::socket_t& controlSocket)
{
    zmq::pollitem_t poller;
    if (hasBroker) {
        auto ctx = ZmqContextManager::getContextPointer();
        if (brokerPort < 0) {
            brokerPort = getDefaultBrokerPort();
        }

        zmq::socket_t brokerReq(ctx->getBaseContext(), ZMQ_REQ);
        brokerReq.setsockopt(ZMQ_LINGER, 50);
        try {
            brokerReq.connect(makePortAddress(brokerTargetAddress, brokerPort + 1));
        }
        catch (zmq::error_t& ze) {
            logError(std::string("unable to connect with broker at ") +
                     makePortAddress(brokerTargetAddress, brokerPort + 1) + ":(" + name + ")" +
                     ze.what());
            setTxStatus(ConnectionStatus::ERRORED);
            ActionMessage M(CMD_PROTOCOL);
            M.messageID = DISCONNECT_ERROR;
            controlSocket.send(M.to_string());
            return (-1);
        }

        hasBroker = true;
        zmq::message_t msg;
        if (PortNumber < 0) {
            int cnt = 0;

            int cnt2 = 0;
            while (PortNumber < 0) {
                if (requestDisconnect.load(std::memory_order_acquire)) {
                    ActionMessage M(CMD_PROTOCOL);
                    M.messageID = DISCONNECT;
                    controlSocket.send(M.to_string());
                    return (-3);
                }
                ActionMessage getPorts = generatePortRequest((serverMode) ? 2 : 1);
                if (useJsonSerialization) {
                    setActionFlag(getPorts, use_json_serialization_flag);
                }
                auto str =
                    (useJsonSerialization) ? getPorts.to_json_string() : getPorts.to_string();

                brokerReq.send(str);
                poller.socket = static_cast<void*>(brokerReq);
                poller.events = ZMQ_POLLIN;
                int rc = 0;
                while (rc == 0) {
                    ++cnt2;
                    rc = zmq::poll(&poller, 1, connectionTimeout);
                    if (rc < 0) {
                        logError("ZMQ broker connection error (2)");
                        setTxStatus(ConnectionStatus::ERRORED);
                        break;
                    }
                    if (rc == 0) {
                        if (requestDisconnect.load(std::memory_order_acquire)) {
                            ActionMessage M(CMD_PROTOCOL);
                            M.messageID = DISCONNECT;
                            controlSocket.send(M.to_string());
                            return (-3);
                        }
                        if (cnt2 == 1) {
                            logWarning("zmq broker connection timed out, trying again (2)");
                            logWarning(std::string("sending message to ") +
                                       makePortAddress(brokerTargetAddress, brokerPort + 1));
                        } else if (cnt2 > maxRetries) {
                            logError("zmq broker connection timed out after trying " +
                                     std::to_string(maxRetries) + " times (2)");
                            setTxStatus(ConnectionStatus::ERRORED);
                            break;
                        }
                        // try to reestablish the connection
                        brokerReq.close();
                        brokerReq = zmq::socket_t(ctx->getBaseContext(), ZMQ_REQ);
                        brokerReq.setsockopt(ZMQ_LINGER, 50);
                        try {
                            brokerReq.connect(makePortAddress(brokerTargetAddress, brokerPort + 1));
                            poller.socket = static_cast<void*>(brokerReq);
                        }
                        catch (zmq::error_t& ze) {
                            logError(std::string("unable to connect with broker at ") +
                                     makePortAddress(brokerTargetAddress, brokerPort + 1) + ":(" +
                                     name + ")" + ze.what());
                            setTxStatus(ConnectionStatus::ERRORED);
                            ActionMessage M(CMD_PROTOCOL);
                            M.messageID = DISCONNECT_ERROR;
                            controlSocket.send(M.to_string());
                            return (-1);
                        }
                        break;
                    }
                }

                if (getTxStatus() == ConnectionStatus::ERRORED) {
                    ActionMessage M(CMD_PROTOCOL);
                    M.messageID = DISCONNECT_ERROR;
                    controlSocket.send(M.to_string());
                    return (-1);
                }
                if (rc > 0) {
                    brokerReq.recv(msg);

                    ActionMessage rxcmd(static_cast<std::byte*>(msg.data()), msg.size());
                    if (isProtocolCommand(rxcmd)) {
                        if (rxcmd.messageID == PORT_DEFINITIONS) {
                            controlSocket.send(msg, zmq::send_flags::none);
                            return 0;
                        }
                        if (rxcmd.messageID == DISCONNECT) {
                            controlSocket.send(msg, zmq::send_flags::none);
                            setTxStatus(ConnectionStatus::TERMINATED);
                            return (-3);
                        }
                        if (rxcmd.messageID == DISCONNECT_ERROR) {
                            controlSocket.send(msg, zmq::send_flags::none);
                            setTxStatus(ConnectionStatus::ERRORED);
                            return (-4);
                        }
                        if (rxcmd.messageID == NEW_BROKER_INFORMATION) {
                            logMessage("got new broker information");
                            brokerReq.disconnect(
                                makePortAddress(brokerTargetAddress, brokerPort + 1));
                            auto brkprt =
                                gmlc::networking::extractInterfaceAndPort(rxcmd.getString(0));
                            brokerPort = brkprt.second;
                            if (brkprt.first != "?") {
                                brokerTargetAddress = brkprt.first;
                            }
                            try {
                                brokerReq.connect(
                                    makePortAddress(brokerTargetAddress, brokerPort + 1));
                            }
                            catch (zmq::error_t& ze) {
                                logError(std::string("unable to connect with broker at ") +
                                         makePortAddress(brokerTargetAddress, brokerPort + 1) +
                                         ":(" + name + ")" + ze.what());
                                setTxStatus(ConnectionStatus::ERRORED);
                                ActionMessage M(CMD_PROTOCOL);
                                M.messageID = DISCONNECT_ERROR;
                                controlSocket.send(M.to_string());
                                return (-1);
                            }
                        } else if (rxcmd.messageID == DELAY_CONNECTION) {
                            std::this_thread::sleep_for(std::chrono::seconds(2));
                        }
                    }
                }
                ++cnt;
                if (cnt > maxRetries) {
                    // we can't get the broker to respond with port numbers
                    setTxStatus(ConnectionStatus::ERRORED);
                    return (-1);
                }
            }
        }
    } else {
        if ((PortNumber < 0)) {
            PortNumber = getDefaultBrokerPort();
            ActionMessage setPorts(CMD_PROTOCOL);
            setPorts.messageID = PORT_DEFINITIONS;
            setPorts.setExtraData(PortNumber);
            auto str = setPorts.to_string();
            controlSocket.send(str);
        }
    }
    return 0;
}